

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

void __thiscall arangodb::velocypack::Builder::appendInt(Builder *this,int64_t v,uint8_t base)

{
  ValueLength *pVVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  ValueLength VVar6;
  byte bVar7;
  
  if ((char)v == v) {
    uVar5 = 1;
  }
  else {
    uVar5 = 1;
    cVar3 = '\a';
    uVar4 = v >> 0x3f ^ v;
    do {
      uVar5 = uVar5 + 1;
      cVar3 = cVar3 + -1;
      bVar2 = 0x7fff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar2);
    if (cVar3 == '\0') {
      uVar5 = 8;
      VVar6 = 9;
      goto LAB_00107c4a;
    }
  }
  v = v + (v >> 0x3f & 2L << ((char)uVar5 * '\b' - 1U & 0x3f));
  VVar6 = (ValueLength)(uVar5 + 1);
LAB_00107c4a:
  reserve(this,VVar6);
  VVar6 = this->_pos;
  this->_pos = VVar6 + 1;
  this->_start[VVar6] = base + (char)uVar5;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  do {
    VVar6 = this->_pos;
    this->_pos = VVar6 + 1;
    this->_start[VVar6] = (uint8_t)v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    v = (ulong)v >> 8;
    bVar7 = (char)uVar5 - 1;
    uVar5 = (uint)bVar7;
  } while (bVar7 != 0);
  return;
}

Assistant:

void appendInt(int64_t v, uint8_t base) {
    uint8_t vSize = intLength(v);
    uint64_t x;
    if (vSize == 8) {
      x = toUInt64(v);
    } else {
      int64_t shift = 1LL << (vSize * 8 - 1);  // will never overflow!
      x = v >= 0 ? static_cast<uint64_t>(v)
                 : static_cast<uint64_t>(v + shift) + shift;
    }
    reserve(1 + vSize);
    appendByteUnchecked(base + vSize);
    while (vSize-- > 0) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }